

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key-storage.c
# Opt level: O0

int ndn_key_storage_add_trusted_certificate(ndn_data_t *certificate)

{
  uint32_t key_id;
  byte local_29;
  int ret;
  uint8_t i;
  ndn_ecc_pub_t *pub_key;
  uint32_t keyid;
  ndn_data_t *certificate_local;
  
  key_id = key_id_from_cert_name(&certificate->name);
  _ret = (ndn_ecc_pub_t *)0x0;
  local_29 = 0;
  do {
    if (9 < local_29) {
LAB_0010e8d9:
      certificate_local._4_4_ =
           ndn_ecc_pub_init(_ret,certificate->content_value + (certificate->content_size - 0x40),
                            0x40,' ',key_id);
      if (certificate_local._4_4_ == 0) {
        certificate_local._4_4_ = 0;
      }
      return certificate_local._4_4_;
    }
    if (storage.trusted_ecc_pub_keys[local_29].key_id == 0xffffffff) {
      _ret = storage.trusted_ecc_pub_keys + local_29;
      goto LAB_0010e8d9;
    }
    local_29 = local_29 + 1;
  } while( true );
}

Assistant:

int
ndn_key_storage_add_trusted_certificate(const ndn_data_t* certificate)
{
  uint32_t keyid = key_id_from_cert_name(&certificate->name);
  // find an empty ECC key
  ndn_ecc_pub_t* pub_key = NULL;
  for (uint8_t i = 0; i < NDN_SEC_SIGNING_KEYS_SIZE; i++) {
    if (storage.trusted_ecc_pub_keys[i].key_id == NDN_SEC_INVALID_KEY_ID) {
      pub_key = &storage.trusted_ecc_pub_keys[i];
      break;
    }
  }
  // load the certificate key into trusted ecc pub keys
  int ret = ndn_ecc_pub_init(pub_key,
                             certificate->content_value + (certificate->content_size - NDN_SEC_ECC_SECP256R1_PUBLIC_KEY_SIZE),
                             NDN_SEC_ECC_SECP256R1_PUBLIC_KEY_SIZE, NDN_ECDSA_CURVE_SECP256R1, keyid);
  if (ret != NDN_SUCCESS) return ret;
  return NDN_SUCCESS;
}